

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O1

void __thiscall
Js::BoundFunction::BoundFunction(BoundFunction *this,Arguments *args,DynamicType *type)

{
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  char *addr_02;
  ScriptContext *requestContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  DynamicTypeHandler *pDVar9;
  Recycler *this_00;
  WriteBarrierPtr<void> *pWVar10;
  type_info *aValue;
  size_t size;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  Arguments *pAVar14;
  undefined **local_70;
  Var varLength;
  ulong local_60;
  char *local_58;
  DWORD local_50;
  type_info *local_48;
  ScriptContext *local_40;
  Arguments *local_38;
  
  JavascriptFunction::JavascriptFunction
            (&this->super_JavascriptFunction,type,(FunctionInfo *)functionInfo);
  (this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01507940;
  (this->boundArgs).ptr = (WriteBarrierPtr<void> *)0x0;
  (this->targetFunction).ptr = (RecyclableObject *)0x0;
  (this->boundThis).ptr = (void *)0x0;
  this->count = 0;
  JavascriptFunction::VerifyEntryPoint(&this->super_JavascriptFunction);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x1c,"(args.Info.Count > 0)",
                                "wrong number of args in BoundFunction");
    if (!bVar2) goto LAB_00b355e8;
    *puVar6 = 0;
  }
  addr = &this->targetFunction;
  requestContext =
       (((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr)->
         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  local_38 = args;
  pvVar7 = Arguments::operator[](args,0);
  pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
  Memory::Recycler::WBSetBit((char *)addr);
  (this->targetFunction).ptr = pRVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  local_40 = requestContext;
  BVar3 = CrossSite::NeedMarshalVar((this->targetFunction).ptr,requestContext);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x21,"(!CrossSite::NeedMarshalVar(targetFunction, scriptContext))",
                                "!CrossSite::NeedMarshalVar(targetFunction, scriptContext)");
    if (!bVar2) goto LAB_00b355e8;
    *puVar6 = 0;
  }
  pRVar8 = JavascriptOperators::GetPrototype(addr->ptr);
  if (pRVar8 != (type->super_Type).prototype.ptr) {
    if (type->isShared == true) {
      DynamicObject::ChangeType((DynamicObject *)this);
      type = (DynamicType *)
             (this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr;
    }
    addr_00 = &(type->super_Type).prototype;
    Memory::Recycler::WBSetBit((char *)addr_00);
    (type->super_Type).prototype.ptr = pRVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  }
  pAVar14 = local_38;
  aValue = (type_info *)0x0;
  BVar3 = JavascriptOperators::HasOwnProperty(addr->ptr,0xd1,local_40,(PropertyString *)0x0);
  if (BVar3 == 1) {
    pRVar8 = addr->ptr;
    aValue = (type_info *)0x0;
    iVar4 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x12])
                      (pRVar8,pRVar8,0xd1,&stack0xffffffffffffff90,0,local_40);
    if (iVar4 == 1) {
      uVar13 = (ulong)local_70 & 0xffff000000000000;
      uVar11 = (ulong)local_70 & 0x1ffff00000000;
      aValue = (type_info *)local_70;
      if (uVar11 != 0x1000000000000 && uVar13 == 0x1000000000000) {
        local_48 = (type_info *)local_70;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00b355e8;
        *puVar6 = 0;
        aValue = local_48;
      }
      pAVar14 = local_38;
      if (uVar13 == 0x1000000000000) {
        if (uVar11 != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00b355e8;
          *puVar6 = 0;
        }
      }
      else {
        uVar5 = JavascriptConversion::ToInt32_Full(aValue,local_40);
        aValue = (type_info *)(ulong)uVar5;
        pAVar14 = local_38;
      }
    }
  }
  addr_01 = &this->boundThis;
  local_48 = aValue;
  pDVar9 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  (*pDVar9->_vptr_DynamicTypeHandler[0x10])(pDVar9,this);
  if (((ulong)pAVar14->Info & 0xfffffe) == 0) {
    pRVar8 = (((local_40->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
    Memory::Recycler::WBSetBit((char *)addr_01);
    addr_01->ptr = pRVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  }
  else {
    pvVar7 = Arguments::operator[](pAVar14,1);
    Memory::Recycler::WBSetBit((char *)addr_01);
    pAVar14 = local_38;
    (this->boundThis).ptr = pvVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
    uVar5 = (*(uint *)&pAVar14->Info & 0xffffff) - 2;
    this->count = uVar5;
    if ((*(uint *)&pAVar14->Info & 0xffffff) < 3) goto LAB_00b3559b;
    local_60 = (ulong)uVar5;
    local_70 = &Memory::WriteBarrierPtr<void>::typeinfo;
    varLength = (Var)0x0;
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
    ;
    local_50 = 0x47;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (local_40->recycler,(TrackAllocData *)&stack0xffffffffffffff90);
    uVar5 = this->count;
    if ((ulong)uVar5 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      pWVar10 = (WriteBarrierPtr<void> *)&DAT_00000008;
    }
    else {
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b355e8;
        *puVar6 = 0;
      }
      size = (ulong)uVar5 << 3;
      pWVar10 = (WriteBarrierPtr<void> *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (this_00,size);
      if (pWVar10 == (WriteBarrierPtr<void> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00b355e8:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      memset(pWVar10,0,size);
    }
    Memory::Recycler::WBSetBit((char *)&this->boundArgs);
    (this->boundArgs).ptr = pWVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->boundArgs);
    if (this->count != 0) {
      lVar12 = 0;
      uVar11 = 0;
      pAVar14 = local_38;
      do {
        local_40 = (ScriptContext *)Arguments::operator[](pAVar14,(int)uVar11 + 2);
        pWVar10 = (this->boundArgs).ptr;
        addr_02 = (char *)((long)&pWVar10->ptr + lVar12);
        Memory::Recycler::WBSetBit(addr_02);
        pAVar14 = local_38;
        *(ScriptContext **)((long)&pWVar10->ptr + lVar12) = local_40;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 8;
      } while (uVar11 < this->count);
    }
  }
LAB_00b3559b:
  uVar5 = (int)local_48 - this->count;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this,0xd1,(ulong)uVar5 | 0x1000000000000,2,0,0,0);
  return;
}

Assistant:

BoundFunction::BoundFunction(Arguments args, DynamicType * type)
        : JavascriptFunction(type, &functionInfo),
        count(0),
        boundArgs(nullptr)
    {
        DebugOnly(VerifyEntryPoint());
        AssertMsg(args.Info.Count > 0, "wrong number of args in BoundFunction");

        ScriptContext *scriptContext = this->GetScriptContext();
        targetFunction = VarTo<RecyclableObject>(args[0]);

        Assert(!CrossSite::NeedMarshalVar(targetFunction, scriptContext));

        // Let proto be targetFunction.[[GetPrototypeOf]]().
        RecyclableObject* proto = JavascriptOperators::GetPrototype(targetFunction);
        if (proto != type->GetPrototype())
        {
            if (type->GetIsShared())
            {
                this->ChangeType();
                type = this->GetDynamicType();
            }
            type->SetPrototype(proto);
        }

        int len = 0;
        // If targetFunction is proxy, need to make sure that traps are called in right order as per 19.2.3.2 in RC#4 dated April 3rd 2015.
        // additionally need to get the correct length value for the boundFunctions' length property
        if (JavascriptOperators::HasOwnProperty(targetFunction, PropertyIds::length, scriptContext, nullptr) == TRUE)
        {
            Var varLength;
            if (targetFunction->GetProperty(targetFunction, PropertyIds::length, &varLength, nullptr, scriptContext))
            {
                len = JavascriptConversion::ToInt32(varLength, scriptContext);
            }
        }
        GetTypeHandler()->EnsureObjectReady(this);

        if (args.Info.Count > 1)
        {
            boundThis = args[1];

            // function object and "this" arg
            const uint countAccountedFor = 2;
            count = args.Info.Count - countAccountedFor;

            // Store the args excluding function obj and "this" arg
            if (args.Info.Count > 2)
            {
                boundArgs = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), count);

                for (uint i=0; i<count; i++)
                {
                    boundArgs[i] = args[i+countAccountedFor];
                }
            }
        }
        else
        {
            // If no "this" is passed, "undefined" is used
            boundThis = scriptContext->GetLibrary()->GetUndefined();
        }

        // Reduce length number of bound args
        len = len - this->count;
        len = max(len, 0);

        SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(len), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
    }